

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options_boost_po.cc
# Opt level: O0

void __thiscall
VW::config::options_boost_po::add_to_description_impl<VW::config::typelist<>>
          (options_boost_po *this,shared_ptr<VW::config::base_option> *opt,
          options_description *options_description)

{
  undefined8 uVar1;
  stringstream __msg;
  string *in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe44;
  char *in_stack_fffffffffffffe48;
  vw_exception *in_stack_fffffffffffffe50;
  stringstream local_1a0 [16];
  ostream local_190;
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::operator<<(&local_190,"That is an unsupported option type.");
  uVar1 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  vw_exception::vw_exception
            (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,in_stack_fffffffffffffe44,
             in_stack_fffffffffffffe38);
  __cxa_throw(uVar1,&vw_exception::typeinfo,vw_exception::~vw_exception);
}

Assistant:

void options_boost_po::add_to_description_impl<typelist<>>(
    std::shared_ptr<base_option> opt, po::options_description& options_description)
{
  THROW("That is an unsupported option type.");
}